

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

void __thiscall pm::Sampler::Sampler(Sampler *this,Type type,uint numSamples)

{
  uint numSamples_local;
  Type type_local;
  Sampler *this_local;
  
  this->_vptr_Sampler = (_func_int **)&PTR__Sampler_00152b38;
  this->type_ = type;
  this->numSamples_ = numSamples;
  this->numSets_ = 0x53;
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::vector(&this->samples_);
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::vector(&this->diskSamples_);
  std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::vector(&this->hemisphereSamples_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->shuffledIndices_);
  Random::Random(&this->rnd_);
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::reserve
            (&this->samples_,(ulong)(this->numSamples_ * this->numSets_));
  setupShuffleIndices(this);
  return;
}

Assistant:

Sampler::Sampler(Type type, unsigned int numSamples)
    : type_(type), numSamples_(numSamples), numSets_(83)
{
	samples_.reserve(numSamples_ * numSets_);
	setupShuffleIndices();
}